

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompositionfunctions.cpp
# Opt level: O0

void comp_func_solid_SourceOver(uint *dest,int length,uint color,uint const_alpha)

{
  undefined8 in_RDI;
  undefined4 unaff_retaddr;
  
  comp_func_solid_SourceOver_template<Argb32OperationsC>
            ((Type *)CONCAT44(const_alpha,unaff_retaddr),(int)((ulong)in_RDI >> 0x20),length,
             (uint)in_RDI);
  return;
}

Assistant:

void QT_FASTCALL comp_func_solid_SourceOver(uint *dest, int length, uint color, uint const_alpha)
{
    comp_func_solid_SourceOver_template<Argb32Operations>(dest, length, color, const_alpha);
}